

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void CompressTables(lemon *lemp)

{
  state *psVar1;
  state *psVar2;
  bool bVar3;
  symbol *psVar4;
  action *paVar5;
  int iVar6;
  int iVar7;
  action *paVar8;
  long lVar9;
  state *psVar10;
  
  if (0 < lemp->nstate) {
    lVar9 = 0;
    do {
      psVar1 = lemp->sorted[lVar9];
      paVar5 = psVar1->ap;
      if (paVar5 == (action *)0x0) {
        bVar3 = true;
        psVar10 = (state *)0x0;
      }
      else {
        bVar3 = false;
        iVar6 = 0;
        psVar10 = (state *)0x0;
        do {
          if ((paVar5->type == SHIFT) && (paVar5->sp == lemp->wildcard)) {
            bVar3 = true;
          }
          if (((paVar5->type == REDUCE) && (psVar2 = (paVar5->x).stp, psVar2->statenum == 0)) &&
             (psVar2 != psVar10)) {
            iVar7 = 1;
            for (paVar8 = paVar5->next; paVar8 != (action *)0x0; paVar8 = paVar8->next) {
              if (paVar8->type == REDUCE) {
                iVar7 = iVar7 + (uint)((paVar8->x).stp == psVar2 && (paVar8->x).stp != psVar10);
              }
            }
            if (iVar6 < iVar7) {
              psVar10 = psVar2;
              iVar6 = iVar7;
            }
          }
          paVar5 = paVar5->next;
        } while (paVar5 != (action *)0x0);
        bVar3 = bVar3 || iVar6 < 1;
      }
      if (!bVar3) {
        paVar5 = psVar1->ap;
        while( true ) {
          if (paVar5 == (action *)0x0) {
            __assert_fail("ap",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/misc/lemon.c"
                          ,0x1057,"void CompressTables(struct lemon *)");
          }
          if ((paVar5->type == REDUCE) && ((paVar5->x).stp == psVar10)) break;
          paVar5 = paVar5->next;
        }
        psVar4 = Symbol_new("{default}");
        paVar5->sp = psVar4;
        for (paVar5 = paVar5->next; paVar5 != (action *)0x0; paVar5 = paVar5->next) {
          if ((paVar5->type == REDUCE) && ((paVar5->x).stp == psVar10)) {
            paVar5->type = NOT_USED;
          }
        }
        paVar5 = (action *)msort((char *)psVar1->ap,(char **)&psVar1->ap->next,actioncmp);
        psVar1->ap = paVar5;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < lemp->nstate);
  }
  return;
}

Assistant:

void CompressTables(struct lemon *lemp)
{
  struct state *stp;
  struct action *ap, *ap2;
  struct rule *rp, *rp2, *rbest;
  int nbest, n;
  int i;
  int usesWildcard;

  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    nbest = 0;
    rbest = 0;
    usesWildcard = 0;

    for(ap=stp->ap; ap; ap=ap->next){
      if( ap->type==SHIFT && ap->sp==lemp->wildcard ){
        usesWildcard = 1;
      }
      if( ap->type!=REDUCE ) continue;
      rp = ap->x.rp;
      if( rp->lhsStart ) continue;
      if( rp==rbest ) continue;
      n = 1;
      for(ap2=ap->next; ap2; ap2=ap2->next){
        if( ap2->type!=REDUCE ) continue;
        rp2 = ap2->x.rp;
        if( rp2==rbest ) continue;
        if( rp2==rp ) n++;
      }
      if( n>nbest ){
        nbest = n;
        rbest = rp;
      }
    }
 
    /* Do not make a default if the number of rules to default
    ** is not at least 1 or if the wildcard token is a possible
    ** lookahead.
    */
    if( nbest<1 || usesWildcard ) continue;


    /* Combine matching REDUCE actions into a single default */
    for(ap=stp->ap; ap; ap=ap->next){
      if( ap->type==REDUCE && ap->x.rp==rbest ) break;
    }
    assert( ap );
    ap->sp = Symbol_new("{default}");
    for(ap=ap->next; ap; ap=ap->next){
      if( ap->type==REDUCE && ap->x.rp==rbest ) ap->type = NOT_USED;
    }
    stp->ap = Action_sort(stp->ap);
  }
}